

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::generateFragShaderOutAssign
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,string *valuePrefix,
               string *outputPrefix)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  pointer pSVar4;
  char *pcVar5;
  ostream *poVar6;
  DataType local_84;
  DataType intBaseType;
  int vecSize;
  int vecNdx;
  int numVecs;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_38;
  const_iterator output;
  string *outputPrefix_local;
  string *valuePrefix_local;
  bool useIntOutputs_local;
  ShaderSpec *shaderSpec_local;
  ostream *src_local;
  
  output._M_current = (Symbol *)outputPrefix;
  local_38._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  do {
    _vecNdx = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                        *)&vecNdx);
    if (!bVar1) {
      return;
    }
    if (useIntOutputs) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_38);
      DVar2 = glu::VarType::getBasicType(&pSVar4->varType);
      bVar1 = glu::isDataTypeFloatOrVec(DVar2);
      if (!bVar1) goto LAB_00cdaf17;
      poVar6 = std::operator<<(src,"\to_");
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_38);
      poVar6 = std::operator<<(poVar6,(string *)pSVar4);
      poVar6 = std::operator<<(poVar6," = floatBitsToUint(");
      poVar6 = std::operator<<(poVar6,(string *)valuePrefix);
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_38);
      poVar6 = std::operator<<(poVar6,(string *)pSVar4);
      std::operator<<(poVar6,");\n");
    }
    else {
LAB_00cdaf17:
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_38);
      DVar2 = glu::VarType::getBasicType(&pSVar4->varType);
      bVar1 = glu::isDataTypeMatrix(DVar2);
      if (bVar1) {
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                 ::operator->(&local_38);
        DVar2 = glu::VarType::getBasicType(&pSVar4->varType);
        iVar3 = glu::getDataTypeMatrixNumColumns(DVar2);
        for (intBaseType = TYPE_INVALID; (int)intBaseType < iVar3;
            intBaseType = intBaseType + TYPE_FLOAT) {
          if (useIntOutputs) {
            poVar6 = std::operator<<(src,"\t");
            poVar6 = std::operator<<(poVar6,(string *)output._M_current);
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                     ::operator->(&local_38);
            poVar6 = std::operator<<(poVar6,(string *)pSVar4);
            poVar6 = std::operator<<(poVar6,"_");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,intBaseType);
            poVar6 = std::operator<<(poVar6," = floatBitsToUint(");
            poVar6 = std::operator<<(poVar6,(string *)valuePrefix);
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                     ::operator->(&local_38);
            poVar6 = std::operator<<(poVar6,(string *)pSVar4);
            poVar6 = std::operator<<(poVar6,"[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,intBaseType);
            std::operator<<(poVar6,"]);\n");
          }
          else {
            poVar6 = std::operator<<(src,"\t");
            poVar6 = std::operator<<(poVar6,(string *)output._M_current);
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                     ::operator->(&local_38);
            poVar6 = std::operator<<(poVar6,(string *)pSVar4);
            poVar6 = std::operator<<(poVar6,"_");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,intBaseType);
            poVar6 = std::operator<<(poVar6," = ");
            poVar6 = std::operator<<(poVar6,(string *)valuePrefix);
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                     ::operator->(&local_38);
            poVar6 = std::operator<<(poVar6,(string *)pSVar4);
            poVar6 = std::operator<<(poVar6,"[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,intBaseType);
            std::operator<<(poVar6,"];\n");
          }
        }
      }
      else {
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                 ::operator->(&local_38);
        DVar2 = glu::VarType::getBasicType(&pSVar4->varType);
        bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
        if (bVar1) {
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                   ::operator->(&local_38);
          DVar2 = glu::VarType::getBasicType(&pSVar4->varType);
          iVar3 = glu::getDataTypeScalarSize(DVar2);
          if (iVar3 < 2) {
            local_84 = TYPE_INT;
          }
          else {
            local_84 = glu::getDataTypeIntVec(iVar3);
          }
          poVar6 = std::operator<<(src,"\t");
          poVar6 = std::operator<<(poVar6,(string *)output._M_current);
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                   ::operator->(&local_38);
          poVar6 = std::operator<<(poVar6,(string *)pSVar4);
          poVar6 = std::operator<<(poVar6," = ");
          pcVar5 = glu::getDataTypeName(local_84);
          poVar6 = std::operator<<(poVar6,pcVar5);
          poVar6 = std::operator<<(poVar6,"(");
          poVar6 = std::operator<<(poVar6,(string *)valuePrefix);
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                   ::operator->(&local_38);
          poVar6 = std::operator<<(poVar6,(string *)pSVar4);
          std::operator<<(poVar6,");\n");
        }
        else {
          poVar6 = std::operator<<(src,"\t");
          poVar6 = std::operator<<(poVar6,(string *)output._M_current);
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                   ::operator->(&local_38);
          poVar6 = std::operator<<(poVar6,(string *)pSVar4);
          poVar6 = std::operator<<(poVar6," = ");
          poVar6 = std::operator<<(poVar6,(string *)valuePrefix);
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                   ::operator->(&local_38);
          poVar6 = std::operator<<(poVar6,(string *)pSVar4);
          std::operator<<(poVar6,";\n");
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

static void generateFragShaderOutAssign (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::string& valuePrefix, const std::string& outputPrefix)
{
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (useIntOutputs && glu::isDataTypeFloatOrVec(output->varType.getBasicType()))
			src << "	o_" << output->name << " = floatBitsToUint(" << valuePrefix << output->name << ");\n";
		else if (glu::isDataTypeMatrix(output->varType.getBasicType()))
		{
			const int	numVecs		= glu::getDataTypeMatrixNumColumns(output->varType.getBasicType());

			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
				if (useIntOutputs)
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = floatBitsToUint(" << valuePrefix << output->name << "[" << vecNdx << "]);\n";
				else
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = " << valuePrefix << output->name << "[" << vecNdx << "];\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << valuePrefix << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << valuePrefix << output->name << ";\n";
	}
}